

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O0

void __thiscall
duckdb::WindowValueLocalState::Finalize
          (WindowValueLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection)

{
  bool bVar1;
  WindowCollection *in_RDX;
  WindowExecutorLocalState *in_RSI;
  CollectionPtr in_RDI;
  WindowIndexTreeLocalState *value_state;
  WindowMergeSortTreeLocalState *in_stack_ffffffffffffffd0;
  CollectionPtr args_1;
  
  args_1.ptr = in_RDI.ptr;
  WindowExecutorLocalState::Finalize(in_RSI,(WindowExecutorGlobalState *)in_RDX,in_RDI);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
                      *)0x1a46a55);
  if (bVar1) {
    unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
    ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                  *)in_stack_ffffffffffffffd0);
    WindowAggregatorState::Cast<duckdb::WindowIndexTreeLocalState>
              (&in_stack_ffffffffffffffd0->super_WindowAggregatorState);
    WindowMergeSortTreeLocalState::Sort(in_stack_ffffffffffffffd0);
    WindowMergeSortTree::Build((WindowMergeSortTree *)in_stack_ffffffffffffffd0);
  }
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *
                     )0x1a46aa3);
  if ((!bVar1) &&
     (*(long *)(*(long *)((long)&in_RDI.ptr[1].lock.super___mutex_base._M_mutex + 8) + 0x90) != -1))
  {
    optional_ptr<duckdb::WindowCollection,_true>::operator*
              ((optional_ptr<duckdb::WindowCollection,_true> *)in_stack_ffffffffffffffd0);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,unsigned_long_const&>
              (in_RDX,(unsigned_long *)args_1.ptr);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator=
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               in_stack_ffffffffffffffd0,
               (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               in_RDI.ptr);
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               0x1a46b04);
  }
  return;
}

Assistant:

void WindowValueLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	WindowExecutorBoundsState::Finalize(gstate, collection);

	if (local_value) {
		auto &value_state = local_value->Cast<WindowIndexTreeLocalState>();
		value_state.Sort();
		value_state.index_tree.Build();
	}

	// Prepare to scan
	if (!cursor && gvstate.child_idx != DConstants::INVALID_INDEX) {
		cursor = make_uniq<WindowCursor>(*collection, gvstate.child_idx);
	}
}